

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh2_echo.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  char *pcVar2;
  uint uVar3;
  in_addr_t iVar4;
  int __fd;
  int iVar5;
  LIBSSH2_SESSION *session;
  long lVar6;
  long lVar7;
  size_t sVar8;
  size_t sVar9;
  undefined1 *puVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *exitsignal;
  size_t len;
  int type;
  sockaddr_in sin;
  libssh2_knownhost *host;
  long *plVar15;
  uint local_7d78;
  uint local_7d74;
  long local_7d70;
  undefined1 *local_7d68;
  undefined8 local_7d60;
  ulong local_7d58;
  undefined1 local_7d4c [4];
  sockaddr local_7d48;
  long local_7d38 [4001];
  
  local_7d70 = 0;
  if (((1 < argc) && (hostname = argv[1], argc != 2)) && (username = argv[2], 3 < (uint)argc)) {
    password = argv[3];
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  iVar4 = inet_addr(hostname);
  iVar5 = 0;
  __fd = socket(2,1,0);
  if (__fd == -1) {
    main_cold_13();
  }
  else {
    local_7d48.sa_family = 2;
    local_7d48.sa_data[0] = '\0';
    local_7d48.sa_data[1] = '\x16';
    local_7d48.sa_data._2_4_ = iVar4;
    iVar5 = connect(__fd,&local_7d48,0x10);
    if (iVar5 == 0) {
      iVar5 = 0;
      session = (LIBSSH2_SESSION *)libssh2_session_init_ex(0,0,0,0);
      if (session == (LIBSSH2_SESSION *)0x0) {
        main_cold_12();
      }
      else {
        libssh2_session_set_blocking(session,0);
        do {
          uVar3 = libssh2_session_handshake(session,__fd);
        } while (uVar3 == 0xffffffdb);
        if (uVar3 == 0) {
          lVar6 = libssh2_knownhost_init(session);
          if (lVar6 == 0) {
            return 2;
          }
          libssh2_knownhost_readfile(lVar6,"known_hosts",1);
          libssh2_knownhost_writefile(lVar6,"dumpfile",1);
          lVar7 = libssh2_session_hostkey(session,&local_7d60,local_7d4c);
          if (lVar7 == 0) {
            return 3;
          }
          plVar15 = local_7d38;
          uVar3 = libssh2_knownhost_checkp(lVar6,hostname,0x16,lVar7,local_7d60,0x10001,plVar15);
          if ((int)uVar3 < 2) {
            pcVar11 = *(char **)(local_7d38[0] + 0x18);
          }
          else {
            pcVar11 = "<none>";
          }
          fprintf(_stderr,"Host check: %d, key: %s\n",(ulong)uVar3,pcVar11);
          libssh2_knownhost_free(lVar6);
          if (*password != '\0') {
            do {
              pcVar11 = username;
              sVar8 = strlen(username);
              pcVar2 = password;
              sVar9 = strlen(password);
              iVar5 = libssh2_userauth_password_ex
                                (session,pcVar11,sVar8 & 0xffffffff,pcVar2,sVar9 & 0xffffffff,0);
            } while (iVar5 == -0x25);
            if (iVar5 != 0) {
              main_cold_2();
              return 1;
            }
          }
          libssh2_trace(session,0x200);
          uVar14 = (ulong)plVar15 & 0xffffffff00000000;
          lVar6 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,uVar14);
          while (lVar6 == 0) {
            iVar5 = libssh2_session_last_error(session,0,0,0);
            if (iVar5 != -0x25) {
              main_cold_3();
              return 1;
            }
            waitsocket(__fd,session);
            uVar14 = uVar14 & 0xffffffff00000000;
            lVar6 = libssh2_channel_open_ex(session,"session",7,0x200000,0x8000,0,uVar14);
          }
          while (iVar5 = libssh2_channel_process_startup(lVar6,"exec",4,"cat",3), iVar5 == -0x25) {
            waitsocket(__fd,session);
          }
          if (iVar5 != 0) {
            main_cold_11();
            return 1;
          }
          memset(local_7d38,0x41,32000);
          puVar10 = (undefined1 *)malloc(0x20);
          if (puVar10 == (undefined1 *)0x0) {
            main_cold_10();
            return 1;
          }
          *puVar10 = 2;
          *(long *)(puVar10 + 8) = lVar6;
          local_7d68 = puVar10 + 0x10;
          *(undefined8 *)(puVar10 + 0x10) = 5;
          uVar14 = 0;
          uVar13 = 0;
          local_7d74 = 0;
          local_7d78 = 0;
          do {
            do {
              iVar5 = libssh2_poll(puVar10,1,10);
            } while (iVar5 < 1);
            bVar1 = false;
            if ((puVar10[0x18] & 1) != 0) {
              lVar7 = libssh2_channel_read_ex(lVar6,0,local_7d38,32000);
              if (lVar7 == -0x25) {
                local_7d74 = local_7d74 + 1;
                fwrite("will read again\n",0x10,1,_stderr);
              }
              else {
                if (lVar7 < 0) {
                  main_cold_4();
                  return 1;
                }
                uVar13 = uVar13 + lVar7;
                fprintf(_stderr,"read %ld bytes (%lu in total)\n",lVar7,uVar13);
              }
              bVar1 = true;
            }
            if ((puVar10[0x18] & 4) != 0) {
              if (uVar14 < 1500000) {
                uVar12 = 1500000 - uVar14;
                if (31999 < uVar12) {
                  uVar12 = 32000;
                }
                lVar7 = libssh2_channel_write_ex(lVar6,0,local_7d38,uVar12);
                if (lVar7 == -0x25) {
                  local_7d78 = local_7d78 + 1;
                  fwrite("will write again\n",0x11,1,_stderr);
                }
                else {
                  if (lVar7 < 0) {
                    main_cold_9();
                    return 1;
                  }
                  main_cold_8();
                  uVar14 = local_7d58;
                }
              }
              else {
                iVar5 = libssh2_channel_send_eof(lVar6);
                if (iVar5 == -0x25) {
                  main_cold_7();
                }
                else {
                  if (iVar5 < 0) {
                    main_cold_6();
                    return 1;
                  }
                  main_cold_5();
                }
              }
              bVar1 = true;
            }
          } while ((bVar1) || ((*(ulong *)(puVar10 + 0x18) & 0x80) == 0));
          while (iVar5 = libssh2_channel_close(lVar6), iVar5 == -0x25) {
            waitsocket(__fd,session);
          }
          if (iVar5 == 0) {
            iVar5 = libssh2_channel_get_exit_status(lVar6);
            libssh2_channel_get_exit_signal(lVar6,&local_7d70,0,0,0,0,0);
            if (local_7d70 != 0) {
              fprintf(_stderr,"\nGot signal: %s\n");
            }
          }
          else {
            iVar5 = 0x7f;
          }
          libssh2_channel_free(lVar6);
          fprintf(_stderr,"\nrereads: %d rewrites: %d totwritten %lu\n",(ulong)local_7d74,
                  (ulong)local_7d78,uVar14);
          if (uVar14 != uVar13) {
            fprintf(_stderr,"\n*** FAIL bytes written: %lu bytes read: %lu ***\n",uVar14,uVar13);
            return 1;
          }
        }
        else {
          iVar5 = 0;
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
        }
        libssh2_session_disconnect_ex(session,0xb,"Normal Shutdown","");
        libssh2_session_free(session);
      }
    }
    else {
      main_cold_1();
      iVar5 = 0;
    }
    shutdown(__fd,2);
    close(__fd);
  }
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return iVar5;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_CHANNEL *channel;
    int exitcode = 0;
    char *exitsignal = NULL;
    size_t len;
    LIBSSH2_KNOWNHOSTS *nh;
    int type;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostname = argv[1];  /* must be ip address only */
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    hostaddr = inet_addr(hostname);

    /* Ultra basic "connect to port 22 on localhost".  Your code is
     * responsible for creating the socket establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* tell libssh2 we want it all done non-blocking */
    libssh2_session_set_blocking(session, 0);

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    while((rc = libssh2_session_handshake(session, sock)) ==
          LIBSSH2_ERROR_EAGAIN);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    nh = libssh2_knownhost_init(session);
    if(!nh) {
        /* eeek, do cleanup here */
        return 2;
    }

    /* read all hosts from here */
    libssh2_knownhost_readfile(nh, "known_hosts",
                               LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    /* store all known hosts to here */
    libssh2_knownhost_writefile(nh, "dumpfile",
                                LIBSSH2_KNOWNHOST_FILE_OPENSSH);

    fingerprint = libssh2_session_hostkey(session, &len, &type);
    if(fingerprint) {
        struct libssh2_knownhost *host;
        int check = libssh2_knownhost_checkp(nh, hostname, 22,
                                             fingerprint, len,
                                             LIBSSH2_KNOWNHOST_TYPE_PLAIN|
                                             LIBSSH2_KNOWNHOST_KEYENC_RAW,
                                             &host);

        fprintf(stderr, "Host check: %d, key: %s\n", check,
                (check <= LIBSSH2_KNOWNHOST_CHECK_MISMATCH) ?
                host->key : "<none>");

        /*****
         * At this point, we could verify that 'check' tells us the key is
         * fine or bail out.
         *****/
    }
    else {
        /* eeek, do cleanup here */
        return 3;
    }
    libssh2_knownhost_free(nh);

    if(strlen(password) != 0) {
        /* We could authenticate via password */
        while((rc = libssh2_userauth_password(session, username, password)) ==
              LIBSSH2_ERROR_EAGAIN);
        if(rc) {
            fprintf(stderr, "Authentication by password failed.\n");
            return 1;
        }
    }

    libssh2_trace(session, LIBSSH2_TRACE_SOCKET);

    /* Exec non-blocking on the remote host */
    do {
        channel = libssh2_channel_open_session(session);
        if(channel ||
           libssh2_session_last_error(session, NULL, NULL, 0) !=
           LIBSSH2_ERROR_EAGAIN)
            break;
        waitsocket(sock, session);
    } while(1);
    if(!channel) {
        fprintf(stderr, "Error\n");
        return 1;
    }
    while((rc = libssh2_channel_exec(channel, commandline)) ==
          LIBSSH2_ERROR_EAGAIN) {
        waitsocket(sock, session);
    }
    if(rc) {
        fprintf(stderr, "exec error\n");
        return 1;
    }
    else {
        LIBSSH2_POLLFD *fds = NULL;
        int running = 1;
        size_t bufsize = BUFSIZE;
        char buffer[BUFSIZE];
        size_t totsize = 1500000;
        size_t totwritten = 0;
        size_t totread = 0;
        int rereads = 0;
        int rewrites = 0;
        int i;

        for(i = 0; i < BUFSIZE; i++)
            buffer[i] = 'A';

        fds = malloc(sizeof(LIBSSH2_POLLFD));
        if(!fds) {
            fprintf(stderr, "malloc failed\n");
            return 1;
        }

        fds[0].type = LIBSSH2_POLLFD_CHANNEL;
        fds[0].fd.channel = channel;
        fds[0].events = LIBSSH2_POLLFD_POLLIN | LIBSSH2_POLLFD_POLLOUT;

        do {
            int act = 0;
            rc = libssh2_poll(fds, 1, 10);

            if(rc < 1)
                continue;

            if(fds[0].revents & LIBSSH2_POLLFD_POLLIN) {
                ssize_t n = libssh2_channel_read(channel,
                                                 buffer, sizeof(buffer));
                act++;

                if(n == LIBSSH2_ERROR_EAGAIN) {
                    rereads++;
                    fprintf(stderr, "will read again\n");
                }
                else if(n < 0) {
                    fprintf(stderr, "read failed\n");
                    return 1;
                }
                else {
                    totread += (size_t)n;
                    fprintf(stderr, "read %ld bytes (%lu in total)\n",
                            (long)n, (unsigned long)totread);
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_POLLOUT) {
                act++;

                if(totwritten < totsize) {
                    /* we have not written all data yet */
                    size_t left = totsize - totwritten;
                    size_t size = (left < bufsize) ? left : bufsize;
                    ssize_t n = libssh2_channel_write_ex(channel, 0,
                                                         buffer, size);

                    if(n == LIBSSH2_ERROR_EAGAIN) {
                        rewrites++;
                        fprintf(stderr, "will write again\n");
                    }
                    else if(n < 0) {
                        fprintf(stderr, "write failed\n");
                        return 1;
                    }
                    else {
                        totwritten += (size_t)n;
                        fprintf(stderr, "wrote %ld bytes (%lu in total)",
                                (long)n, (unsigned long)totwritten);
                        if(left >= bufsize && (size_t)n != bufsize) {
                            fprintf(stderr, " PARTIAL");
                        }
                        fprintf(stderr, "\n");
                    }
                }
                else {
                    /* all data written, send EOF */
                    rc = libssh2_channel_send_eof(channel);

                    if(rc == LIBSSH2_ERROR_EAGAIN) {
                        fprintf(stderr, "will send eof again\n");
                    }
                    else if(rc < 0) {
                        fprintf(stderr, "send eof failed\n");
                        return 1;
                    }
                    else {
                        fprintf(stderr, "sent eof\n");
                        /* we're done writing, stop listening for OUT events */
                        fds[0].events &=
                            ~(unsigned long)LIBSSH2_POLLFD_POLLOUT;
                    }
                }
            }

            if(fds[0].revents & LIBSSH2_POLLFD_CHANNEL_CLOSED) {
                if(!act) /* don't leave loop until we have read all data */
                    running = 0;
            }
        } while(running);

        exitcode = 127;
        while((rc = libssh2_channel_close(channel)) == LIBSSH2_ERROR_EAGAIN)
            waitsocket(sock, session);

        if(rc == 0) {
            exitcode = libssh2_channel_get_exit_status(channel);
            libssh2_channel_get_exit_signal(channel, &exitsignal,
                                            NULL, NULL, NULL, NULL, NULL);
        }

        if(exitsignal)
            fprintf(stderr, "\nGot signal: %s\n",
                    exitsignal ? exitsignal : "none");

        libssh2_channel_free(channel);
        channel = NULL;

        fprintf(stderr, "\nrereads: %d rewrites: %d totwritten %lu\n",
                rereads, rewrites, (unsigned long)totwritten);

        if(totwritten != totread) {
            fprintf(stderr, "\n*** FAIL bytes written: "
                    "%lu bytes read: %lu ***\n",
                    (unsigned long)totwritten, (unsigned long)totread);
            return 1;
        }
    }

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return exitcode;
}